

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_reader.c
# Opt level: O0

uint16_t read_primitive_subexpfin_(aom_reader *r,uint16_t n,uint16_t k)

{
  uint16_t uVar1;
  int bits;
  int iVar2;
  int iVar3;
  ushort in_DX;
  ushort in_SI;
  int a;
  int b;
  int mk;
  int i;
  uint local_28;
  short sVar4;
  int iVar5;
  
  iVar5 = 0;
  iVar3 = 0;
  while( true ) {
    uVar1 = (uint16_t)((uint)iVar3 >> 0x10);
    sVar4 = (short)iVar3;
    if (iVar5 == 0) {
      local_28 = (uint)in_DX;
    }
    else {
      local_28 = ((uint)in_DX + iVar5) - 1;
    }
    bits = 1 << ((byte)local_28 & 0x1f);
    if ((int)(uint)in_SI <= iVar3 + bits * 3) break;
    iVar2 = aom_read_bit_((aom_reader *)CONCAT26(uVar1,CONCAT24(sVar4,local_28)));
    if (iVar2 == 0) {
      iVar5 = aom_read_literal_((aom_reader *)
                                CONCAT26((short)((uint)iVar3 >> 0x10),
                                         CONCAT24((short)iVar3,local_28)),bits);
      return (short)iVar5 + (short)iVar3;
    }
    iVar5 = iVar5 + 1;
    iVar3 = bits + iVar3;
  }
  uVar1 = read_primitive_quniform_((aom_reader *)CONCAT26(in_SI,CONCAT24(in_DX,iVar5)),uVar1);
  return uVar1 + sVar4;
}

Assistant:

static uint16_t read_primitive_subexpfin_(aom_reader *r, uint16_t n,
                                          uint16_t k ACCT_STR_PARAM) {
  int i = 0;
  int mk = 0;

  while (1) {
    int b = (i ? k + i - 1 : k);
    int a = (1 << b);

    if (n <= mk + 3 * a) {
      return read_primitive_quniform(r, n - mk, ACCT_STR_NAME) + mk;
    }

    if (!aom_read_bit(r, ACCT_STR_NAME)) {
      return aom_read_literal(r, b, ACCT_STR_NAME) + mk;
    }

    i = i + 1;
    mk += a;
  }

  assert(0);
  return 0;
}